

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O1

bool cmSystemTools::RemoveRPath(string *file,string *emsg,bool *removed)

{
  void *pvVar1;
  StringEntry *__tmp;
  StringEntry *pSVar2;
  unsigned_long uVar3;
  unsigned_long uVar4;
  long *plVar5;
  ulong uVar6;
  long lVar7;
  pointer ppVar8;
  char *pcVar9;
  unsigned_long *puVar10;
  uint uVar11;
  ulong uVar12;
  long lVar13;
  long lVar14;
  pointer ppVar15;
  pointer pcVar16;
  long lVar17;
  bool bVar18;
  bool bVar19;
  bool bVar20;
  DynamicEntryList dentries;
  StringEntry *se [2];
  unsigned_long zeroSize [2];
  unsigned_long zeroPosition [2];
  ofstream f;
  pointer local_2b8;
  DynamicEntryList local_2a0;
  StringEntry *local_288 [2];
  bool *local_278;
  ulong local_270;
  unsigned_long local_268 [4];
  vector<char,_std::allocator<char>_> local_248;
  undefined1 local_230 [32];
  byte abStack_210 [216];
  ios_base local_138 [264];
  
  if (removed != (bool *)0x0) {
    *removed = false;
  }
  local_268[2] = 0;
  local_268[3] = 0;
  local_268[0] = 0;
  local_268[1] = 0;
  cmELF::cmELF((cmELF *)local_230,(file->_M_dataplus)._M_p);
  local_288[0] = (StringEntry *)0x0;
  local_288[1] = (StringEntry *)0x0;
  pSVar2 = cmELF::GetRPath((cmELF *)local_230);
  bVar19 = pSVar2 != (StringEntry *)0x0;
  if (bVar19) {
    local_288[0] = pSVar2;
  }
  pSVar2 = cmELF::GetRunPath((cmELF *)local_230);
  uVar12 = (ulong)bVar19;
  if (pSVar2 != (StringEntry *)0x0) {
    uVar12 = (ulong)(bVar19 + 1);
    local_288[bVar19] = pSVar2;
  }
  pSVar2 = local_288[0];
  uVar11 = (uint)uVar12;
  bVar19 = uVar11 == 0;
  local_278 = removed;
  if (bVar19) {
    pcVar16 = (pointer)0x0;
    local_2b8 = (pointer)0x0;
    bVar18 = false;
    uVar3 = 0;
    uVar11 = 0;
  }
  else {
    if ((uVar11 == 2) && (local_288[1]->IndexInSection < local_288[0]->IndexInSection)) {
      local_288[0] = local_288[1];
      local_288[1] = pSVar2;
    }
    cmELF::GetDynamicEntries(&local_2a0,(cmELF *)local_230);
    bVar20 = (pointer)CONCAT71(local_2a0.
                               super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
                               ._M_impl.super__Vector_impl_data._M_start._1_7_,
                               local_2a0.
                               super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
                               ._M_impl.super__Vector_impl_data._M_start._0_1_) ==
             local_2a0.
             super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    bVar18 = !bVar20;
    if (bVar20) {
      if (emsg == (string *)0x0) {
        pcVar16 = (pointer)0x0;
        local_2b8 = (pointer)0x0;
        uVar3 = 0;
        uVar11 = 0;
      }
      else {
        pcVar16 = (pointer)0x0;
        std::__cxx11::string::_M_replace((ulong)emsg,0,(char *)emsg->_M_string_length,0x558d4a);
        local_2b8 = (pointer)0x0;
        uVar3 = 0;
        uVar11 = 0;
      }
    }
    else {
      if (uVar11 != 0) {
        uVar6 = 0;
        do {
          pSVar2 = local_288[uVar6];
          local_268[uVar6 + 2] = pSVar2->Position;
          local_268[uVar6] = pSVar2->Size;
          uVar6 = uVar6 + 1;
        } while (uVar12 != uVar6);
      }
      uVar3 = cmELF::GetDynamicEntryPosition((cmELF *)local_230,1);
      uVar4 = cmELF::GetDynamicEntryPosition((cmELF *)local_230,0);
      ppVar8 = (pointer)CONCAT71(local_2a0.
                                 super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                 local_2a0.
                                 super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start._0_1_);
      if (ppVar8 != local_2a0.
                    super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish) {
        lVar13 = 0;
        lVar14 = -(long)local_2a0.
                        super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
        do {
          lVar14 = lVar14 + 0x10;
          lVar7 = -(long)ppVar8;
          puVar10 = &ppVar8[1].second;
          ppVar15 = ppVar8;
          while ((lVar17 = ppVar15->first, lVar17 != 0xf && (lVar17 != 0x1d))) {
            if (lVar17 == 0x70000035) {
              ppVar15->second = ppVar15->second + lVar13 * (uVar3 - uVar4);
            }
            ppVar15 = ppVar15 + 1;
            lVar7 = lVar7 + -0x10;
            puVar10 = puVar10 + 2;
            if (ppVar15 ==
                local_2a0.
                super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
                ._M_impl.super__Vector_impl_data._M_finish) goto LAB_00275407;
          }
          if (((pointer)(0x10 - lVar7) !=
               local_2a0.
               super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_finish) &&
             (lVar17 = lVar7 - lVar14 >> 4, 0 < lVar17)) {
            lVar17 = lVar17 + 1;
            do {
              puVar10[-3] = ((pair<long,_unsigned_long> *)(puVar10 + -1))->first;
              puVar10[-2] = *puVar10;
              lVar17 = lVar17 + -1;
              puVar10 = puVar10 + 2;
            } while (1 < lVar17);
          }
          ppVar8 = (pointer)-lVar7;
          local_2a0.
          super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
          ._M_impl.super__Vector_impl_data._M_finish =
               local_2a0.
               super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
               ._M_impl.super__Vector_impl_data._M_finish + -1;
          lVar13 = lVar13 + 1;
        } while (ppVar15 !=
                 local_2a0.
                 super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish);
      }
LAB_00275407:
      cmELF::EncodeDynamicEntries(&local_248,(cmELF *)local_230,&local_2a0);
      uVar3 = cmELF::GetDynamicEntryPosition((cmELF *)local_230,0);
      pcVar16 = local_248.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage;
      local_2b8 = local_248.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start;
    }
    pvVar1 = (void *)CONCAT71(local_2a0.
                              super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
                              ._M_impl.super__Vector_impl_data._M_start._1_7_,
                              local_2a0.
                              super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
                              ._M_impl.super__Vector_impl_data._M_start._0_1_);
    if (pvVar1 != (void *)0x0) {
      operator_delete(pvVar1,(long)local_2a0.
                                   super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
                                   ._M_impl.super__Vector_impl_data._M_end_of_storage - (long)pvVar1
                     );
    }
  }
  cmELF::~cmELF((cmELF *)local_230);
  if (!bVar18) goto LAB_002755f2;
  std::ofstream::ofstream(local_230,(file->_M_dataplus)._M_p,_S_out|_S_in|_S_bin);
  if ((abStack_210
       [(long)(((cmELFInternal *)(local_230._0_8_ + -0x58))->DynamicSectionStrings)._M_t._M_impl.
              super__Rb_tree_header._M_header._M_left] & 5) == 0) {
    plVar5 = (long *)std::ostream::seekp(local_230,uVar3,0);
    if ((*(byte *)((long)plVar5 + *(long *)(*plVar5 + -0x18) + 0x20) & 5) == 0) {
      plVar5 = (long *)std::ostream::write(local_230,(long)local_2b8);
      if ((*(byte *)((long)plVar5 + *(long *)(*plVar5 + -0x18) + 0x20) & 5) == 0) {
        bVar18 = uVar11 != 0;
        if (uVar11 != 0) {
          local_270 = (ulong)uVar11;
          uVar12 = 0;
          do {
            plVar5 = (long *)std::ostream::seekp((ostream *)local_230,local_268[uVar12 + 2],0);
            if ((*(byte *)((long)plVar5 + *(long *)(*plVar5 + -0x18) + 0x20) & 5) != 0) {
              if (emsg == (string *)0x0) {
LAB_002756e8:
                bVar19 = false;
              }
              else {
                pcVar9 = "Error seeking to RPATH position.";
LAB_002756d5:
                std::__cxx11::string::operator=((string *)emsg,pcVar9);
                bVar19 = false;
              }
              break;
            }
            for (uVar3 = local_268[uVar12]; uVar3 != 0; uVar3 = uVar3 - 1) {
              local_2a0.
              super__Vector_base<std::pair<long,_unsigned_long>,_std::allocator<std::pair<long,_unsigned_long>_>_>
              ._M_impl.super__Vector_impl_data._M_start._0_1_ = 0;
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)local_230,(char *)&local_2a0,1);
            }
            if ((abStack_210
                 [(long)(((cmELFInternal *)(local_230._0_8_ + -0x58))->DynamicSectionStrings)._M_t.
                        _M_impl.super__Rb_tree_header._M_header._M_left] & 5) != 0) {
              if (emsg == (string *)0x0) goto LAB_002756e8;
              pcVar9 = "Error writing the empty rpath string to the file.";
              goto LAB_002756d5;
            }
            uVar12 = uVar12 + 1;
            bVar18 = uVar12 < local_270;
          } while (uVar12 != local_270);
        }
        bVar19 = (bool)(bVar18 ^ 1U | bVar19);
        if ((local_278 != (bool *)0x0) && (bVar18 == false)) {
          *local_278 = true;
          bVar19 = true;
        }
        goto LAB_002755ba;
      }
      if (emsg == (string *)0x0) goto LAB_002755b7;
      pcVar9 = "Error replacing DYNAMIC table header.";
    }
    else {
      if (emsg == (string *)0x0) goto LAB_002755b7;
      pcVar9 = "Error seeking to DYNAMIC table header for RPATH.";
    }
LAB_002755a2:
    bVar19 = false;
    std::__cxx11::string::_M_replace((ulong)emsg,0,(char *)emsg->_M_string_length,(ulong)pcVar9);
  }
  else {
    if (emsg != (string *)0x0) {
      pcVar9 = "Error opening file for update.";
      goto LAB_002755a2;
    }
LAB_002755b7:
    bVar19 = false;
  }
LAB_002755ba:
  local_230._0_8_ = _VTT;
  *(undefined8 *)
   (local_230 +
   (long)_VTT[-1].DynamicSectionStrings._M_t._M_impl.super__Rb_tree_header._M_header._M_left) =
       _vtable;
  std::filebuf::~filebuf((filebuf *)(local_230 + 8));
  std::ios_base::~ios_base(local_138);
LAB_002755f2:
  if (local_2b8 != (pointer)0x0) {
    operator_delete(local_2b8,(long)pcVar16 - (long)local_2b8);
  }
  return bVar19;
}

Assistant:

bool cmSystemTools::RemoveRPath(std::string const& file, std::string* emsg,
                                bool* removed)
{
#if defined(CMAKE_USE_ELF_PARSER)
  if (removed) {
    *removed = false;
  }
  int zeroCount = 0;
  unsigned long zeroPosition[2] = { 0, 0 };
  unsigned long zeroSize[2] = { 0, 0 };
  unsigned long bytesBegin = 0;
  std::vector<char> bytes;
  {
    // Parse the ELF binary.
    cmELF elf(file.c_str());

    // Get the RPATH and RUNPATH entries from it and sort them by index
    // in the dynamic section header.
    int se_count = 0;
    cmELF::StringEntry const* se[2] = { CM_NULLPTR, CM_NULLPTR };
    if (cmELF::StringEntry const* se_rpath = elf.GetRPath()) {
      se[se_count++] = se_rpath;
    }
    if (cmELF::StringEntry const* se_runpath = elf.GetRunPath()) {
      se[se_count++] = se_runpath;
    }
    if (se_count == 0) {
      // There is no RPATH or RUNPATH anyway.
      return true;
    }
    if (se_count == 2 && se[1]->IndexInSection < se[0]->IndexInSection) {
      std::swap(se[0], se[1]);
    }

    // Obtain a copy of the dynamic entries
    cmELF::DynamicEntryList dentries = elf.GetDynamicEntries();
    if (dentries.empty()) {
      // This should happen only for invalid ELF files where a DT_NULL
      // appears before the end of the table.
      if (emsg) {
        *emsg = "DYNAMIC section contains a DT_NULL before the end.";
      }
      return false;
    }

    // Save information about the string entries to be zeroed.
    zeroCount = se_count;
    for (int i = 0; i < se_count; ++i) {
      zeroPosition[i] = se[i]->Position;
      zeroSize[i] = se[i]->Size;
    }

    // Get size of one DYNAMIC entry
    unsigned long const sizeof_dentry =
      elf.GetDynamicEntryPosition(1) - elf.GetDynamicEntryPosition(0);

    // Adjust the entry list as necessary to remove the run path
    unsigned long entriesErased = 0;
    for (cmELF::DynamicEntryList::iterator it = dentries.begin();
         it != dentries.end();) {
      if (it->first == cmELF::TagRPath || it->first == cmELF::TagRunPath) {
        it = dentries.erase(it);
        entriesErased++;
        continue;
      }
      if (cmELF::TagMipsRldMapRel != 0 &&
          it->first == cmELF::TagMipsRldMapRel) {
        // Background: debuggers need to know the "linker map" which contains
        // the addresses each dynamic object is loaded at. Most arches use
        // the DT_DEBUG tag which the dynamic linker writes to (directly) and
        // contain the location of the linker map, however on MIPS the
        // .dynamic section is always read-only so this is not possible. MIPS
        // objects instead contain a DT_MIPS_RLD_MAP tag which contains the
        // address where the dyanmic linker will write to (an indirect
        // version of DT_DEBUG). Since this doesn't work when using PIE, a
        // relative equivalent was created - DT_MIPS_RLD_MAP_REL. Since this
        // version contains a relative offset, moving it changes the
        // calculated address. This may cause the dyanmic linker to write
        // into memory it should not be changing.
        //
        // To fix this, we adjust the value of DT_MIPS_RLD_MAP_REL here. If
        // we move it up by n bytes, we add n bytes to the value of this tag.
        it->second += entriesErased * sizeof_dentry;
      }

      it++;
    }

    // Encode new entries list
    bytes = elf.EncodeDynamicEntries(dentries);
    bytesBegin = elf.GetDynamicEntryPosition(0);
  }

  // Open the file for update.
  cmsys::ofstream f(file.c_str(),
                    std::ios::in | std::ios::out | std::ios::binary);
  if (!f) {
    if (emsg) {
      *emsg = "Error opening file for update.";
    }
    return false;
  }

  // Write the new DYNAMIC table header.
  if (!f.seekp(bytesBegin)) {
    if (emsg) {
      *emsg = "Error seeking to DYNAMIC table header for RPATH.";
    }
    return false;
  }
  if (!f.write(&bytes[0], bytes.size())) {
    if (emsg) {
      *emsg = "Error replacing DYNAMIC table header.";
    }
    return false;
  }

  // Fill the RPATH and RUNPATH strings with zero bytes.
  for (int i = 0; i < zeroCount; ++i) {
    if (!f.seekp(zeroPosition[i])) {
      if (emsg) {
        *emsg = "Error seeking to RPATH position.";
      }
      return false;
    }
    for (unsigned long j = 0; j < zeroSize[i]; ++j) {
      f << '\0';
    }
    if (!f) {
      if (emsg) {
        *emsg = "Error writing the empty rpath string to the file.";
      }
      return false;
    }
  }

  // Everything was updated successfully.
  if (removed) {
    *removed = true;
  }
  return true;
#else
  (void)file;
  (void)emsg;
  (void)removed;
  return false;
#endif
}